

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::format_uint<4u,char,fmt::v9::appender,unsigned__int128>
                   (appender out,unsigned___int128 value,int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  detail *this;
  bool in_CL;
  int in_EDX;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_RSI;
  buffer<char> *in_RDI;
  char buffer [33];
  char *ptr;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff60;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_ffffffffffffff68;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_8;
  
  to_unsigned<int>(0);
  this = (detail *)
         to_pointer<char>((buffer_appender<char>)in_stack_ffffffffffffff68.container,
                          in_stack_ffffffffffffff60);
  if (this == (detail *)0x0) {
    value_01._8_8_ = in_stack_ffffffffffffff50;
    value_01._0_8_ = in_stack_ffffffffffffff48;
    format_uint<4u,char,unsigned__int128>
              ((detail *)&stack0xffffffffffffff68,(char *)in_RSI.container,
               (unsigned___int128)value_01,in_EDX,in_CL);
    local_8.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v9::appender>
                   (in_RDI,in_stack_ffffffffffffff48,in_RSI.container);
  }
  else {
    value_00._8_8_ = in_stack_ffffffffffffff50;
    value_00._0_8_ = in_stack_ffffffffffffff48;
    format_uint<4u,char,unsigned__int128>
              (this,(char *)in_RSI.container,(unsigned___int128)value_00,in_EDX,in_CL);
    local_8.container = in_RDI;
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_8.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}